

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatcher.cpp
# Opt level: O0

void __thiscall
cppnet::Dispatcher::Listen::anon_class_56_4_e8c7a8e2::operator()(anon_class_56_4_e8c7a8e2 *this)

{
  Dispatcher *pDVar1;
  element_type *peVar2;
  enable_shared_from_this<cppnet::Dispatcher> local_60;
  shared_ptr<cppnet::CppNetBase> local_50 [2];
  weak_ptr<cppnet::EventActions> local_30;
  undefined1 local_20 [8];
  shared_ptr<cppnet::ConnectSocket> connect_sock;
  anon_class_56_4_e8c7a8e2 *this_local;
  
  pDVar1 = this->this;
  connect_sock.super___shared_ptr<cppnet::ConnectSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  MakeConnectSocket();
  peVar2 = std::__shared_ptr_access<cppnet::ConnectSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<cppnet::ConnectSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_20);
  std::weak_ptr<cppnet::EventActions>::weak_ptr<cppnet::EventActions,void>
            (&local_30,&pDVar1->_event_actions);
  Socket::SetEventActions(&peVar2->super_Socket,&local_30);
  std::weak_ptr<cppnet::EventActions>::~weak_ptr(&local_30);
  peVar2 = std::__shared_ptr_access<cppnet::ConnectSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<cppnet::ConnectSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_20);
  std::weak_ptr<cppnet::CppNetBase>::lock((weak_ptr<cppnet::CppNetBase> *)local_50);
  Socket::SetCppNetBase(&peVar2->super_Socket,local_50);
  std::shared_ptr<cppnet::CppNetBase>::~shared_ptr(local_50);
  peVar2 = std::__shared_ptr_access<cppnet::ConnectSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<cppnet::ConnectSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_20);
  Socket::SetSocket(&peVar2->super_Socket,&this->sock);
  peVar2 = std::__shared_ptr_access<cppnet::ConnectSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<cppnet::ConnectSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_20);
  std::enable_shared_from_this<cppnet::Dispatcher>::shared_from_this(&local_60);
  Socket::SetDispatcher(&peVar2->super_Socket,(shared_ptr<cppnet::Dispatcher> *)&local_60);
  std::shared_ptr<cppnet::Dispatcher>::~shared_ptr((shared_ptr<cppnet::Dispatcher> *)&local_60);
  peVar2 = std::__shared_ptr_access<cppnet::ConnectSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<cppnet::ConnectSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_20);
  (*(peVar2->super_Socket)._vptr_Socket[2])(peVar2,&this->ip,(ulong)this->port);
  peVar2 = std::__shared_ptr_access<cppnet::ConnectSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<cppnet::ConnectSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_20);
  (*(peVar2->super_Socket)._vptr_Socket[3])();
  std::shared_ptr<cppnet::ConnectSocket>::~shared_ptr((shared_ptr<cppnet::ConnectSocket> *)local_20)
  ;
  return;
}

Assistant:

void Dispatcher::Listen(uint64_t sock, const std::string& ip, uint16_t port) {
    auto task = [sock, ip, port, this]() {
        auto connect_sock = MakeConnectSocket();
        connect_sock->SetEventActions(_event_actions);
        connect_sock->SetCppNetBase(_cppnet_base.lock());
        connect_sock->SetSocket(sock);
        connect_sock->SetDispatcher(shared_from_this());

        connect_sock->Bind(ip, port);
        connect_sock->Listen();
    };

    if (std::this_thread::get_id() == _local_thread_id) {
        task();

    } else {
        PostTask(task);
    }
}